

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterConversion.h
# Opt level: O2

void PixelToaster::convert_XBGRFFFF_to_XRGB8888(Pixel *source,integer32 *destination,uint count)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  float fVar5;
  
  for (lVar4 = 0; (ulong)count << 2 != lVar4; lVar4 = lVar4 + 4) {
    fVar5 = (float)(~((int)(&source->r)[lVar4] >> 0x1f) & (uint)(&source->r)[lVar4]);
    uVar1 = (int)(fVar5 + 1.0) * 2 & 0xff0000;
    if (0x3f7ffffe < (int)fVar5) {
      uVar1 = 0xff0000;
    }
    fVar5 = (float)(~((int)(&source->g)[lVar4] >> 0x1f) & (uint)(&source->g)[lVar4]);
    uVar2 = (uint)(fVar5 + 1.0) >> 7 & 0xff00;
    if (0x3f7ffffe < (int)fVar5) {
      uVar2 = 0xff00;
    }
    fVar5 = (float)(~((int)(&source->b)[lVar4] >> 0x1f) & (uint)(&source->b)[lVar4]);
    uVar3 = (uint)(fVar5 + 1.0) >> 0xf & 0xff;
    if (0x3f7ffffe < (int)fVar5) {
      uVar3 = 0xff;
    }
    *(uint *)((long)destination + lVar4) = uVar2 | uVar1 | uVar3;
  }
  return;
}

Assistant:

inline void convert_XBGRFFFF_to_XRGB8888(const Pixel source[], integer32 destination[], unsigned int count)
{
    unsigned int offset = 0;

#ifdef PIXELTOASTER_USE_SSE2
    integer32          output[16];
    const unsigned int numBlocks = count / 4;

    for (unsigned int i = 0; i < numBlocks; ++i)
    {
        __m128 p0 = _mm_load_ps(reinterpret_cast<const float*>(&source[4 * i + 0]));
        __m128 p1 = _mm_load_ps(reinterpret_cast<const float*>(&source[4 * i + 1]));
        __m128 p2 = _mm_load_ps(reinterpret_cast<const float*>(&source[4 * i + 2]));
        __m128 p3 = _mm_load_ps(reinterpret_cast<const float*>(&source[4 * i + 3]));

        __m128i f0 = clamped_fraction_8(p0);
        __m128i f1 = clamped_fraction_8(p1);
        __m128i f2 = clamped_fraction_8(p2);
        __m128i f3 = clamped_fraction_8(p3);

        _mm_store_si128(reinterpret_cast<__m128i*>(&output[0]), f0);
        _mm_store_si128(reinterpret_cast<__m128i*>(&output[4]), f1);
        _mm_store_si128(reinterpret_cast<__m128i*>(&output[8]), f2);
        _mm_store_si128(reinterpret_cast<__m128i*>(&output[12]), f3);

        const integer32 r0 = output[0] << 1;
        const integer32 g0 = output[1] >> 7;
        const integer32 b0 = output[2] >> 15;

        const integer32 r1 = output[4] << 1;
        const integer32 g1 = output[5] >> 7;
        const integer32 b1 = output[6] >> 15;

        const integer32 r2 = output[8] << 1;
        const integer32 g2 = output[9] >> 7;
        const integer32 b2 = output[10] >> 15;

        const integer32 r3 = output[12] << 1;
        const integer32 g3 = output[13] >> 7;
        const integer32 b3 = output[14] >> 15;

        destination[4 * i + 0] = r0 | g0 | b0;
        destination[4 * i + 1] = r1 | g1 | b1;
        destination[4 * i + 2] = r2 | g2 | b2;
        destination[4 * i + 3] = r3 | g3 | b3;
    }

    offset += 4 * count;
#endif

    for (unsigned int i = offset; i < count; ++i)
    {
        const integer32 r = clamped_fraction_8(source[i].r) << 1;
        const integer32 g = clamped_fraction_8(source[i].g) >> 7;
        const integer32 b = clamped_fraction_8(source[i].b) >> 15;

        destination[i] = r | g | b;
    }
}